

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O1

void GREATEST_PRINT_REPORT(void)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((greatest_info.flags & 2) != 0) {
    return;
  }
  greatest_info.teardown = (undefined1 *)0x0;
  greatest_info.teardown_udata = (void *)0x0;
  greatest_info.setup = (undefined1 *)0x0;
  greatest_info.setup_udata = (void *)0x0;
  greatest_info.passed = greatest_info.passed + greatest_info.suite.passed;
  greatest_info.failed = greatest_info.failed + greatest_info.suite.failed;
  greatest_info.skipped = greatest_info.skipped + greatest_info.suite.skipped;
  greatest_info.tests_run = greatest_info.tests_run + greatest_info.suite.tests_run;
  greatest_info.suite.tests_run = 0;
  greatest_info.suite.passed = 0;
  greatest_info.suite.failed = 0;
  greatest_info.suite.skipped = 0;
  greatest_info.suite.pre_suite = 0;
  greatest_info.suite.post_suite = 0;
  greatest_info.suite.pre_test = 0;
  greatest_info.suite.post_test = 0;
  greatest_info.col = 0;
  greatest_info.end = clock();
  if (greatest_info.end != -1) {
    pcVar2 = "s";
    pcVar1 = "s";
    if (greatest_info.tests_run == 1) {
      pcVar1 = "";
    }
    fprintf(_stdout,"\nTotal: %u test%s",(ulong)greatest_info.tests_run,pcVar1);
    fprintf(_stdout," (%lu ticks, %.3f sec)",
            SUB84((double)(greatest_info.end - greatest_info.begin) / 1000000.0,0));
    if (greatest_info.assertions == 1) {
      pcVar2 = "";
    }
    fprintf(_stdout,", %u assertion%s\n",(ulong)greatest_info.assertions,pcVar2);
    fprintf(_stdout,"Pass: %u, fail: %u, skip: %u.\n",(ulong)greatest_info.passed,
            (ulong)greatest_info.failed,(ulong)greatest_info.skipped);
    return;
  }
  fprintf(_stdout,"clock error: %s\n","greatest_info.end");
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}